

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O0

void draw_arrowbar(Fl_Color col)

{
  Fl_Color col_local;
  
  fl_color(col);
  fl_begin_polygon();
  fl_vertex(0.2,0.8);
  fl_vertex(0.6,0.8);
  fl_vertex(0.6,-0.8);
  fl_vertex(0.2,-0.8);
  fl_end_polygon();
  fl_begin_polygon();
  fl_vertex(-0.6,0.8);
  fl_vertex(0.2,0.0);
  fl_vertex(-0.6,-0.8);
  fl_end_polygon();
  set_outline_color(col);
  fl_begin_loop();
  fl_vertex(0.2,0.8);
  fl_vertex(0.6,0.8);
  fl_vertex(0.6,-0.8);
  fl_vertex(0.2,-0.8);
  fl_end_loop();
  fl_begin_loop();
  fl_vertex(-0.6,0.8);
  fl_vertex(0.2,0.0);
  fl_vertex(-0.6,-0.8);
  fl_end_loop();
  return;
}

Assistant:

static void draw_arrowbar(Fl_Color col)
{
  fl_color(col);
  BP; vv(0.2,0.8); vv(0.6,0.8); vv(0.6,-0.8); vv(0.2,-0.8); EP;
  BP; vv(-0.6,0.8); vv(0.2,0.0); vv(-0.6,-0.8); EP;
  set_outline_color(col);
  BC; vv(0.2,0.8); vv(0.6,0.8); vv(0.6,-0.8); vv(0.2,-0.8); EC;
  BC; vv(-0.6,0.8); vv(0.2,0.0); vv(-0.6,-0.8); EC;
}